

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O0

Aig_Man_t * Dar_ManChoiceNew(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  void *pvVar1;
  char *pcVar2;
  char *pcVar3;
  abctime aVar4;
  Aig_Man_t *pAVar5;
  Gia_Man_t *p;
  abctime aVar6;
  Vec_Ptr_t *vPios_00;
  abctime clk;
  char *pSpec;
  char *pName;
  void *pManTime;
  Vec_Ptr_t *vPios;
  Gia_Man_t *pGia;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Dch_Pars_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  pvVar1 = pAig->pManTime;
  pAig->pManTime = (void *)0x0;
  pcVar2 = Abc_UtilStrsav(pAig->pName);
  pcVar3 = Abc_UtilStrsav(pAig->pSpec);
  aVar4 = Abc_Clock();
  pAVar5 = Aig_ManDupDfs(pAig);
  p = Dar_NewChoiceSynthesis(pAVar5,1,1,pPars->fPower,pPars->fLightSynth,pPars->fVerbose);
  aVar6 = Abc_Clock();
  pPars->timeSynth = aVar6 - aVar4;
  if (pPars->fUseGia == 0) {
    pAVar5 = Gia_ManToAigSkip(p,3);
    Gia_ManStop(p);
    pTemp = Dch_ComputeChoices(pAVar5,pPars);
    Aig_ManStop(pAVar5);
  }
  else {
    pTemp = Cec_ComputeChoices(p,pPars);
  }
  vPios_00 = Aig_ManOrderPios(pTemp,pAig);
  Aig_ManStop(pAig);
  pAVar5 = Aig_ManDupDfsGuided(pTemp,vPios_00);
  Aig_ManStop(pTemp);
  Vec_PtrFree(vPios_00);
  pAVar5->pManTime = pvVar1;
  Aig_ManChoiceLevel(pAVar5);
  if (pAVar5->pName != (char *)0x0) {
    free(pAVar5->pName);
    pAVar5->pName = (char *)0x0;
  }
  if (pAVar5->pSpec != (char *)0x0) {
    free(pAVar5->pSpec);
    pAVar5->pSpec = (char *)0x0;
  }
  pAVar5->pName = pcVar2;
  pAVar5->pSpec = pcVar3;
  return pAVar5;
}

Assistant:

Aig_Man_t * Dar_ManChoiceNew( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
    extern Aig_Man_t * Cec_ComputeChoices( Gia_Man_t * pGia, Dch_Pars_t * pPars );
//    extern Aig_Man_t * Dch_DeriveTotalAig( Vec_Ptr_t * vAigs );
    extern Aig_Man_t * Dch_ComputeChoices( Aig_Man_t * pAig, Dch_Pars_t * pPars );
//    int fVerbose = pPars->fVerbose;
    Aig_Man_t * pMan, * pTemp;
    Gia_Man_t * pGia;
    Vec_Ptr_t * vPios;
    void * pManTime;
    char * pName, * pSpec;
    abctime clk;

    // save useful things
    pManTime = pAig->pManTime; pAig->pManTime = NULL;
    pName = Abc_UtilStrsav( pAig->pName );
    pSpec = Abc_UtilStrsav( pAig->pSpec );

    // perform synthesis
clk = Abc_Clock();
    pGia = Dar_NewChoiceSynthesis( Aig_ManDupDfs(pAig), 1, 1, pPars->fPower, pPars->fLightSynth, pPars->fVerbose );
pPars->timeSynth = Abc_Clock() - clk;

    // perform choice computation
    if ( pPars->fUseGia )
        pMan = Cec_ComputeChoices( pGia, pPars );
    else
    {
        pMan = Gia_ManToAigSkip( pGia, 3 );
        Gia_ManStop( pGia );
        pMan = Dch_ComputeChoices( pTemp = pMan, pPars );
        Aig_ManStop( pTemp );
    }

    // create guidence
    vPios = Aig_ManOrderPios( pMan, pAig ); 
    Aig_ManStop( pAig );

    // reconstruct the network
    pMan = Aig_ManDupDfsGuided( pTemp = pMan, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );

    // reset levels
    pMan->pManTime = pManTime;
    Aig_ManChoiceLevel( pMan );

    // copy names
    ABC_FREE( pMan->pName );
    ABC_FREE( pMan->pSpec );
    pMan->pName = pName;
    pMan->pSpec = pSpec;
    return pMan;
}